

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O1

char * gzgets(gzFile file,char *buf,int len)

{
  uint uVar1;
  uchar *__s;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  uint uVar5;
  ulong __n;
  char *__dest;
  
  if ((len < 1 || (buf == (char *)0x0 || file == (gzFile)0x0)) || (file[1].have != 0x1c4f)) {
    return (char *)0x0;
  }
  iVar3 = *(int *)((long)&file[4].pos + 4);
  if ((iVar3 == 0) || (iVar3 == -5)) {
    if ((int)file[4].pos != 0) {
      *(undefined4 *)&file[4].pos = 0;
      iVar3 = gz_skip((gz_statep)file,(long)file[4].next);
      if (iVar3 == -1) {
        return (char *)0x0;
      }
    }
    uVar5 = len - 1;
    __dest = buf;
    if (uVar5 != 0) {
      while( true ) {
        if ((file->have == 0) && (iVar3 = gz_fetch((gz_statep)file), iVar3 == -1)) {
          return (char *)0x0;
        }
        uVar1 = file->have;
        if (uVar1 == 0) break;
        if (uVar5 <= uVar1) {
          uVar1 = uVar5;
        }
        __s = file->next;
        pvVar4 = memchr(__s,10,(ulong)uVar1);
        uVar2 = ((int)pvVar4 - (int)__s) + 1;
        if (pvVar4 == (void *)0x0) {
          uVar2 = uVar1;
        }
        __n = (ulong)uVar2;
        memcpy(__dest,__s,__n);
        file->have = file->have - uVar2;
        file->next = file->next + __n;
        file->pos = file->pos + __n;
        __dest = __dest + __n;
        if ((pvVar4 != (void *)0x0) || (uVar5 = uVar5 - uVar2, uVar5 == 0)) goto LAB_001716b1;
      }
      *(undefined4 *)((long)&file[3].next + 4) = 1;
    }
LAB_001716b1:
    if (__dest != buf) {
      *__dest = '\0';
      return buf;
    }
  }
  return (char *)0x0;
}

Assistant:

char * ZEXPORT gzgets(gzFile file, char *buf, int len) {
    unsigned left, n;
    char *str;
    unsigned char *eol;
    gz_statep state;

    /* check parameters and get internal structure */
    if (file == NULL || buf == NULL || len < 1)
        return NULL;
    state = (gz_statep)file;

    /* check that we're reading and that there's no (serious) error */
    if (state->mode != GZ_READ ||
        (state->err != Z_OK && state->err != Z_BUF_ERROR))
        return NULL;

    /* process a skip request */
    if (state->seek) {
        state->seek = 0;
        if (gz_skip(state, state->skip) == -1)
            return NULL;
    }

    /* copy output bytes up to new line or len - 1, whichever comes first --
       append a terminating zero to the string (we don't check for a zero in
       the contents, let the user worry about that) */
    str = buf;
    left = (unsigned)len - 1;
    if (left) do {
        /* assure that something is in the output buffer */
        if (state->x.have == 0 && gz_fetch(state) == -1)
            return NULL;                /* error */
        if (state->x.have == 0) {       /* end of file */
            state->past = 1;            /* read past end */
            break;                      /* return what we have */
        }

        /* look for end-of-line in current output buffer */
        n = state->x.have > left ? left : state->x.have;
        eol = (unsigned char *)memchr(state->x.next, '\n', n);
        if (eol != NULL)
            n = (unsigned)(eol - state->x.next) + 1;

        /* copy through end-of-line, or remainder if not found */
        memcpy(buf, state->x.next, n);
        state->x.have -= n;
        state->x.next += n;
        state->x.pos += n;
        left -= n;
        buf += n;
    } while (left && eol == NULL);

    /* return terminated string, or if nothing, end of file */
    if (buf == str)
        return NULL;
    buf[0] = 0;
    return str;
}